

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

TypedExpectation<test_result_(int)> * __thiscall
testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
          (MockSpec<test_result_(int)> *this,char *file,int line,char *obj,char *call)

{
  TypedExpectation<test_result_(int)> *pTVar1;
  string source_text;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_88,"EXPECT_CALL(",&local_c9);
  std::operator+(&local_68,&local_88,obj);
  std::operator+(&local_48,&local_68,", ");
  std::operator+(&local_c8,&local_48,call);
  std::operator+(&local_a8,&local_c8,")");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::operator+(&local_c8,&local_a8," invoked");
  LogWithLocation(kInfo,file,line,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  pTVar1 = FunctionMockerBase<test_result_(int)>::AddNewExpectation
                     (this->function_mocker_,file,line,&local_a8,&this->matchers_);
  std::__cxx11::string::~string((string *)&local_a8);
  return pTVar1;
}

Assistant:

internal::TypedExpectation<F>& InternalExpectedAt(
      const char* file, int line, const char* obj, const char* call) {
    const string source_text(string("EXPECT_CALL(") + obj + ", " + call + ")");
    LogWithLocation(internal::kInfo, file, line, source_text + " invoked");
    return function_mocker_->AddNewExpectation(
        file, line, source_text, matchers_);
  }